

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

void __thiscall Json::addToHolder(Json *this,string *s)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  Json local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substring;
  
  lVar4 = -1;
  do {
    lVar2 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ((s->_M_dataplus)._M_p[lVar2] == ' ');
  std::__cxx11::string::substr((ulong)&substring,(ulong)s);
  std::__cxx11::string::find((char)s,0x3a);
  std::__cxx11::string::substr((ulong)&key,(ulong)&substring);
  do {
  } while (key._M_dataplus._M_p[key._M_string_length - 1] == ' ');
  std::__cxx11::string::substr((ulong)&local_e0,(ulong)&key);
  std::__cxx11::string::operator=((string *)&key,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::find((char)s,0x3a);
  std::__cxx11::string::substr((ulong)&value,(ulong)&substring);
  lVar4 = 0;
  do {
    pcVar1 = (s->_M_dataplus)._M_p + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 == ' ');
  std::__cxx11::string::substr((ulong)&local_e0,(ulong)&value);
  std::__cxx11::string::operator=((string *)&value,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (*value._M_dataplus._M_p == '\"') {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)&value);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                *)&local_e0,&key,&local_68.first);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                        *)&local_e0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
             *)&local_e0);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    bVar3 = std::operator==(&value,"true");
    if (bVar3) {
      local_68.first._M_dataplus._M_p._0_4_ = CONCAT31(local_68.first._M_dataplus._M_p._1_3_,1);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                  *)&local_e0,&key,(bool *)&local_68);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                  *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                          *)&local_e0);
    }
    else {
      bVar3 = std::operator==(&value,"false");
      if (bVar3) {
        local_68.first._M_dataplus._M_p._0_4_ = (uint)local_68.first._M_dataplus._M_p & 0xffffff00;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                    *)&local_e0,&key,(bool *)&local_68);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                    *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                            *)&local_e0);
      }
      else {
        if (9 < (int)*value._M_dataplus._M_p - 0x30U) {
          Json(&local_e0,&value);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Json,_true>
                    (&local_68,&key,&local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                      *)this,&local_68);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::~pair(&local_68);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)&local_e0);
          goto LAB_0010f028;
        }
        local_68.first._M_dataplus._M_p._0_4_ = std::__cxx11::stoi(&value,(size_t *)0x0,10);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                    *)&local_e0,&key,(int *)&local_68);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::any>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                    *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                            *)&local_e0);
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
             *)&local_e0);
  }
LAB_0010f028:
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&substring);
  return;
}

Assistant:

void Json::addToHolder(const std::string& s) {
    std::size_t offset = 0;
    while (s[offset] == ' ') offset++;
    auto substring = s.substr(offset);
    auto key = substring.substr(1, s.find_first_of(':')-1);
    offset = key.length() - 1;
    while (key[key.length() - 1] == ' ') offset--;
    key = key.substr(0, offset);
    auto value = substring.substr(s.find_first_of(':'));
    offset = 0;
    while (s[offset] == ' ') offset++;
    value = value.substr(offset + 1);
    offset = value.length() - 1;
    while (value[offset] == ' ') offset--;
    if (value[0] == '"') {
        holder.insert(holderPair(key, value.substr(1, value.length() - 2)));
    } else if (value == "true") {
        holder.insert(holderPair(key, true));
    } else if (value == "false") {
        holder.insert(holderPair(key, false));
    } else if (isdigit(value[0])) {
        holder.insert(holderPair(key, std::stoi(value)));
    } else {
        holder.insert(holderPair(key, Json(value)));
    }
}